

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall Mesh::Mesh(Mesh *this,int32_t positionLoc,int32_t normalLoc,int32_t texCoordLoc)

{
  this->m_vertices = 0;
  this->m_indices = 0;
  this->m_positionLoc = positionLoc;
  this->m_normalLoc = normalLoc;
  this->m_texCoordLoc = texCoordLoc;
  VertexArray::VertexArray(&this->m_vao);
  (this->m_indicesData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_indicesData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_indicesData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_verticesData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_verticesData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_verticesData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_drawMode = 4;
  return;
}

Assistant:

Mesh::Mesh(int32_t positionLoc,
           int32_t normalLoc  ,
           int32_t texCoordLoc)
  : m_vertices(0),
    m_indices(0),
    m_positionLoc(positionLoc),
    m_normalLoc(normalLoc),
    m_texCoordLoc(texCoordLoc),
    m_drawMode(GL_TRIANGLES)
{
}